

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall
wabt::WastLexer::GetNameEqNumToken
          (Token *__return_storage_ptr__,WastLexer *this,string_view name,TokenType token_type)

{
  char cVar1;
  int iVar2;
  size_t offset;
  byte *pbVar3;
  size_t sVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  bool bVar9;
  
  offset = name.size_;
  bVar9 = offset == 0;
  if (!bVar9) {
    pbVar3 = (byte *)this->cursor_;
    sVar4 = 0;
    bVar9 = false;
    pbVar6 = pbVar3;
    do {
      cVar1 = name.data_[sVar4];
      uVar8 = 0xffffffff;
      pbVar7 = pbVar6;
      if (pbVar6 < this->buffer_end_) {
        pbVar7 = pbVar6 + 1;
        this->cursor_ = (char *)pbVar7;
        uVar8 = (uint)*pbVar6;
      }
      if (uVar8 != (int)cVar1) {
        this->cursor_ = (char *)pbVar3;
        break;
      }
      sVar4 = sVar4 + 1;
      bVar9 = offset == sVar4;
      pbVar6 = pbVar7;
    } while (!bVar9);
  }
  if (bVar9) {
    pbVar3 = (byte *)this->cursor_;
    bVar9 = false;
    lVar5 = 0;
    pbVar6 = pbVar3;
    do {
      uVar8 = 0xffffffff;
      pbVar7 = pbVar6;
      if (pbVar6 < this->buffer_end_) {
        pbVar7 = pbVar6 + 1;
        this->cursor_ = (char *)pbVar7;
        uVar8 = (uint)*pbVar6;
      }
      if (uVar8 != (int)":0x"[lVar5 + 1]) {
        this->cursor_ = (char *)pbVar3;
        break;
      }
      lVar5 = lVar5 + 1;
      bVar9 = lVar5 == 2;
      pbVar6 = pbVar7;
    } while (!bVar9);
    if (bVar9) {
      bVar9 = ReadHexNum(this);
      if (!bVar9) goto LAB_00183556;
      pbVar3 = (byte *)this->cursor_;
      iVar2 = 0;
      while( true ) {
        if (pbVar3 < this->buffer_end_) {
          lVar5 = (ulong)*pbVar3 + 1;
        }
        else {
          lVar5 = 0;
        }
        if ((""[lVar5] & 1U) == 0) break;
        if (pbVar3 < this->buffer_end_) {
          pbVar3 = pbVar3 + 1;
          this->cursor_ = (char *)pbVar3;
        }
        iVar2 = iVar2 + -1;
      }
    }
    else {
      bVar9 = ReadNum(this);
      if (!bVar9) goto LAB_00183556;
      pbVar3 = (byte *)this->cursor_;
      iVar2 = 0;
      while( true ) {
        if (pbVar3 < this->buffer_end_) {
          lVar5 = (ulong)*pbVar3 + 1;
        }
        else {
          lVar5 = 0;
        }
        if ((""[lVar5] & 1U) == 0) break;
        if (pbVar3 < this->buffer_end_) {
          pbVar3 = pbVar3 + 1;
          this->cursor_ = (char *)pbVar3;
        }
        iVar2 = iVar2 + -1;
      }
    }
    if (iVar2 == 0) {
      TextToken(__return_storage_ptr__,this,token_type,offset);
      return __return_storage_ptr__;
    }
  }
LAB_00183556:
  GetKeywordToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNameEqNumToken(string_view name, TokenType token_type) {
  if (MatchString(name)) {
    if (MatchString("0x")) {
      if (ReadHexNum() && NoTrailingReservedChars()) {
        return TextToken(token_type, name.size());
      }
    } else if (ReadNum() && NoTrailingReservedChars()) {
      return TextToken(token_type, name.size());
    }
  }
  return GetKeywordToken();
}